

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

void do_afk(CHAR_DATA *ch,char *argument)

{
  ulong uVar1;
  char buf [4608];
  char acStack_1218 [4616];
  
  uVar1 = ch->comm[0];
  if (((uint)uVar1 >> 0x19 & 1) == 0) {
    ch->comm[0] = uVar1 | 0x2000000;
    send_to_char("AFK set.\n\r",ch);
    if (*argument == '\0') {
      builtin_strncpy(acStack_1218,"$N is now AFK.",0xf);
    }
    else {
      sprintf(acStack_1218,"$N is now AFK (%s).",argument);
    }
    wiznet(acStack_1218,ch,(OBJ_DATA *)0x0,0,0,0);
    return;
  }
  ch->comm[0] = uVar1 & 0xfffffffffdffffff;
  send_to_char("AFK removed.\n\r",ch);
  wiznet("$N is no longer AFK.",ch,(OBJ_DATA *)0x0,0,0,0);
  do_replay(ch,"");
  return;
}

Assistant:

void do_afk(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH];

	if (IS_SET(ch->comm, COMM_AFK))
	{
		REMOVE_BIT(ch->comm, COMM_AFK);

		send_to_char("AFK removed.\n\r", ch);
		wiznet("$N is no longer AFK.", ch, nullptr, 0, 0, 0);

		do_replay(ch, "");
	}
	else
	{
		SET_BIT(ch->comm, COMM_AFK);

		send_to_char("AFK set.\n\r", ch);

		if (argument[0] != '\0')
			sprintf(buf, "$N is now AFK (%s).", argument);
		else
			sprintf(buf, "$N is now AFK.");

		wiznet(buf, ch, nullptr, 0, 0, 0);
	}
}